

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# leave.hpp
# Opt level: O2

void __thiscall soplex::SPxSolverBase<double>::updateFtest(SPxSolverBase<double> *this)

{
  bool bVar1;
  int iVar2;
  UpdateVector<double> *pUVar3;
  SSVectorBase<double> *pSVar4;
  ulong uVar5;
  int j;
  long lVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  
  pUVar3 = this->theFvec;
  (this->updateViols).super_IdxSet.num = 0;
  dVar7 = entertol(this);
  dVar7 = -dVar7;
  for (uVar5 = (ulong)(uint)(pUVar3->thedelta).super_IdxSet.num; 0 < (int)uVar5; uVar5 = uVar5 - 1)
  {
    iVar2 = (pUVar3->thedelta).super_IdxSet.idx[uVar5 - 1];
    bVar1 = this->m_pricingViolUpToDate;
    if ((bVar1 == true) &&
       (dVar8 = (this->theCoTest).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[iVar2], dVar8 < dVar7)) {
      this->m_pricingViol = dVar8 + this->m_pricingViol;
    }
    dVar8 = (this->theFvec->super_VectorBase<double>).val.
            super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_start[iVar2];
    dVar9 = (this->theUBbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[iVar2];
    if (dVar8 <= dVar9) {
      dVar9 = dVar8 - (this->theLBbound).val.super__Vector_base<double,_std::allocator<double>_>.
                      _M_impl.super__Vector_impl_data._M_start[iVar2];
    }
    else {
      dVar9 = dVar9 - dVar8;
    }
    (this->theCoTest).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start[iVar2] = dVar9;
    if ((this->sparsePricingLeave != true) || (dVar7 <= dVar9)) {
      if ((bVar1 != false) && (dVar9 < dVar7)) {
        this->m_pricingViol = this->m_pricingViol - dVar9;
      }
    }
    else {
      if (bVar1 != false) {
        this->m_pricingViol = this->m_pricingViol - dVar9;
      }
      if ((this->isInfeasible).data[iVar2] == 0) {
        DIdxSet::addIdx(&this->infeasibilities,iVar2);
        (this->isInfeasible).data[iVar2] = 1;
      }
      if (this->hyperPricingLeave == true) {
        DIdxSet::addIdx(&this->updateViols,iVar2);
      }
    }
  }
  if (0 < this->boundflips) {
    dVar8 = epsilon(this);
    for (lVar6 = 0; pSVar4 = this->solveVector3, lVar6 < (pSVar4->super_IdxSet).num;
        lVar6 = lVar6 + 1) {
      iVar2 = (pSVar4->super_IdxSet).idx[lVar6];
      if (dVar8 < ABS((pSVar4->super_VectorBase<double>).val.
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[iVar2])) {
        bVar1 = this->m_pricingViolUpToDate;
        if ((bVar1 == true) &&
           (dVar9 = (this->theCoTest).val.super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_start[iVar2], dVar9 < dVar7)) {
          this->m_pricingViol = dVar9 + this->m_pricingViol;
        }
        dVar9 = (this->theFvec->super_VectorBase<double>).val.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start[iVar2];
        dVar10 = (this->theUBbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[iVar2];
        if (dVar9 <= dVar10) {
          dVar10 = dVar9 - (this->theLBbound).val.
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start[iVar2];
        }
        else {
          dVar10 = dVar10 - dVar9;
        }
        (this->theCoTest).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[iVar2] = dVar10;
        if ((this->sparsePricingLeave != true) || (dVar7 <= dVar10)) {
          if ((bVar1 != false) && (dVar10 < dVar7)) {
            this->m_pricingViol = this->m_pricingViol - dVar10;
          }
        }
        else {
          if (bVar1 != false) {
            this->m_pricingViol = this->m_pricingViol - dVar10;
          }
          if ((this->isInfeasible).data[iVar2] == 0) {
            DIdxSet::addIdx(&this->infeasibilities,iVar2);
            (this->isInfeasible).data[iVar2] = 1;
          }
        }
      }
    }
  }
  return;
}

Assistant:

void SPxSolverBase<R>::updateFtest()
{
   const IdxSet& idx = theFvec->idx();
   VectorBase<R>& ftest = theCoTest;      // |== fTest()|
   assert(&ftest == &fTest());

   assert(type() == LEAVE);

   updateViols.clear();
   R theeps = entertol();

   for(int j = idx.size() - 1; j >= 0; --j)
   {
      int i = idx.index(j);

      if(m_pricingViolUpToDate && ftest[i] < -theeps)
         // violation was present before this iteration
         m_pricingViol += ftest[i];

      ftest[i] = ((*theFvec)[i] > theUBbound[i])
                 ? theUBbound[i] - (*theFvec)[i]
                 : (*theFvec)[i] - theLBbound[i];

      if(sparsePricingLeave && ftest[i] < -theeps)
      {
         assert(remainingRoundsLeave == 0);

         if(m_pricingViolUpToDate)
            m_pricingViol -= ftest[i];

         if(isInfeasible[i] == SPxPricer<R>::NOT_VIOLATED)
         {
            // this can cause problems - we cannot keep on adding indeces to infeasibilities,
            // because they are not deleted in hyper mode...
            //             if( !hyperPricingLeave )
            infeasibilities.addIdx(i);
            isInfeasible[i] = SPxPricer<R>::VIOLATED;
         }

         if(hyperPricingLeave)
            updateViols.addIdx(i);
      }
      else if(m_pricingViolUpToDate && ftest[i] < -theeps)
         m_pricingViol -= ftest[i];
   }

   // if boundflips were performed, we need to update these indices as well
   if(boundflips > 0)
   {
      R eps = epsilon();

      for(int j = 0; j < solveVector3->size(); ++j)
      {
         if(spxAbs(solveVector3->value(j)) > eps)
         {
            int i = solveVector3->index(j);

            if(m_pricingViolUpToDate && ftest[i] < -theeps)
               m_pricingViol += ftest[i];

            ftest[i] = ((*theFvec)[i] > theUBbound[i]) ? theUBbound[i] - (*theFvec)[i] :
                       (*theFvec)[i] - theLBbound[i];

            if(sparsePricingLeave && ftest[i] < -theeps)
            {
               assert(remainingRoundsLeave == 0);

               if(m_pricingViolUpToDate)
                  m_pricingViol -= ftest[i];

               if(!isInfeasible[i])
               {
                  infeasibilities.addIdx(i);
                  isInfeasible[i] = true;
               }
            }
            else if(m_pricingViolUpToDate && ftest[i] < -theeps)
               m_pricingViol -= ftest[i];
         }
      }
   }
}